

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

Error * ot::commissioner::utils::Hex(Error *__return_storage_ptr__,ByteArray *aBuf,string *aHexStr)

{
  pointer *ppuVar1;
  byte bVar2;
  iterator __position;
  char *pcVar3;
  char cVar4;
  byte bVar5;
  int iVar6;
  char *begin_1;
  byte *pbVar7;
  char *pcVar8;
  char *begin;
  long lVar9;
  char *pcVar10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  ulong uVar11;
  byte *pbVar12;
  bool bVar13;
  bool bVar14;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  writer write;
  writer local_90;
  string local_88;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  
  if ((aHexStr->_M_string_length & 1) == 0) {
    bVar13 = aHexStr->_M_string_length != 0;
    if (bVar13) {
      pbVar7 = (byte *)(aHexStr->_M_dataplus)._M_p;
      iVar6 = isxdigit((int)(char)*pbVar7);
      if (iVar6 != 0) {
        uVar11 = 2;
        lVar9 = 0;
        pbVar12 = pbVar7;
        do {
          iVar6 = isxdigit((int)(char)pbVar7[uVar11 - 1]);
          if (iVar6 == 0) break;
          bVar5 = *pbVar12;
          iVar6 = isxdigit((int)(char)bVar5);
          if (iVar6 == 0) {
LAB_00144854:
            abort();
          }
          bVar2 = pbVar7[uVar11 - 1];
          iVar6 = isxdigit((int)(char)bVar2);
          if (iVar6 == 0) goto LAB_00144854;
          cVar4 = -0x30;
          if ((byte)(bVar2 + 0x9f) < 6) {
            cVar4 = -0x57;
          }
          if ((byte)(bVar2 + 0xbf) < 6) {
            cVar4 = -0x37;
          }
          bVar5 = cVar4 + bVar2 | (((byte)((bVar5 & 0xdf) + 0xbf) < 6) * '\t' + bVar5) * '\x10';
          local_68.types_[0]._0_1_ = bVar5;
          __position._M_current =
               (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
            _M_realloc_insert<unsigned_char>(aBuf,__position,(uchar *)&local_68);
          }
          else {
            *__position._M_current = bVar5;
            ppuVar1 = &(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppuVar1 = *ppuVar1 + 1;
          }
          bVar13 = uVar11 < aHexStr->_M_string_length;
          if (!bVar13) goto LAB_001446f7;
          lVar9 = lVar9 + 2;
          pbVar7 = (byte *)(aHexStr->_M_dataplus)._M_p;
          pbVar12 = pbVar7 + lVar9;
          iVar6 = isxdigit((int)(char)pbVar7[uVar11]);
          uVar11 = uVar11 + 2;
        } while (iVar6 != 0);
      }
      local_68.types_[0] = string_type;
      pcVar10 = "{} is not a valid HEX string; there is non-HEX char";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "{} is not a valid HEX string; there is non-HEX char";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x33;
      local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_68.context_.super_basic_format_parse_context<char>._20_4_ = 1;
      local_68.parse_funcs_[0] =
           ::fmt::v10::detail::
           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
      local_90.handler_ = &local_68;
      local_68.context_.types_ = local_68.types_;
      do {
        if (pcVar10 == "") break;
        pcVar8 = pcVar10;
        if (*pcVar10 == '{') {
LAB_0014464e:
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()(&local_90,pcVar10,pcVar8);
          pcVar10 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                              (pcVar8,"",&local_68);
          bVar14 = true;
        }
        else {
          pcVar8 = pcVar10 + 1;
          bVar14 = pcVar8 != "";
          if (bVar14) {
            if (*pcVar8 != '{') {
              pcVar3 = pcVar10 + 2;
              do {
                pcVar8 = pcVar3;
                bVar14 = pcVar8 != "";
                if (pcVar8 == "") goto LAB_0014464a;
                pcVar3 = pcVar8 + 1;
              } while (*pcVar8 != '{');
            }
            bVar14 = true;
          }
LAB_0014464a:
          if (bVar14) goto LAB_0014464e;
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()(&local_90,pcVar10,"");
          bVar14 = false;
        }
      } while (bVar14);
      local_68._0_8_ = (aHexStr->_M_dataplus)._M_p;
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           (char *)aHexStr->_M_string_length;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x33;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&local_68;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_88,(v10 *)"{} is not a valid HEX string; there is non-HEX char",fmt,args);
      __return_storage_ptr__->mCode = kInvalidArgs;
      (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->mMessage).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->mMessage,local_88._M_dataplus._M_p,
                 local_88._M_dataplus._M_p + local_88._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      if (bVar13) {
        return __return_storage_ptr__;
      }
    }
LAB_001446f7:
    __return_storage_ptr__->mCode = kNone;
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mMessage).field_2;
    (__return_storage_ptr__->mMessage)._M_string_length = 0;
    (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  }
  else {
    local_68.types_[0] = string_type;
    pcVar10 = "{} is not a valid HEX string; must have even length";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "{} is not a valid HEX string; must have even length";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x33;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 1;
    local_68.parse_funcs_[0] =
         ::fmt::v10::detail::
         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
    local_90.handler_ = &local_68;
    local_68.context_.types_ = local_68.types_;
    do {
      if (pcVar10 == "") break;
      pcVar8 = pcVar10;
      if (*pcVar10 == '{') {
LAB_001447a5:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()(&local_90,pcVar10,pcVar8);
        pcVar10 = ::fmt::v10::detail::
                  parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                            (pcVar8,"",&local_68);
        bVar13 = true;
      }
      else {
        pcVar8 = pcVar10 + 1;
        bVar13 = pcVar8 != "";
        if (bVar13) {
          if (*pcVar8 != '{') {
            pcVar3 = pcVar10 + 2;
            do {
              pcVar8 = pcVar3;
              bVar13 = pcVar8 != "";
              if (pcVar8 == "") goto LAB_001447a1;
              pcVar3 = pcVar8 + 1;
            } while (*pcVar8 != '{');
          }
          bVar13 = true;
        }
LAB_001447a1:
        if (bVar13) goto LAB_001447a5;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()(&local_90,pcVar10,"");
        bVar13 = false;
      }
    } while (bVar13);
    local_68._0_8_ = (aHexStr->_M_dataplus)._M_p;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         (char *)aHexStr->_M_string_length;
    fmt_00.size_ = 0xd;
    fmt_00.data_ = (char *)0x33;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_88,(v10 *)"{} is not a valid HEX string; must have even length",fmt_00,args_00
              );
    __return_storage_ptr__->mCode = kInvalidArgs;
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mMessage).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->mMessage,local_88._M_dataplus._M_p,
               local_88._M_dataplus._M_p + local_88._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error Hex(ByteArray &aBuf, const std::string &aHexStr)
{
    if (aHexStr.size() % 2 != 0)
    {
        return ERROR_INVALID_ARGS("{} is not a valid HEX string; must have even length", aHexStr);
    }

    for (size_t i = 0; i < aHexStr.size(); i += 2)
    {
        if (!isxdigit(aHexStr[i]) || !isxdigit(aHexStr[i + 1]))
        {
            return ERROR_INVALID_ARGS("{} is not a valid HEX string; there is non-HEX char", aHexStr);
        }
        aBuf.push_back((Hex(aHexStr[i]) << 4) | Hex(aHexStr[i + 1]));
    }
    return ERROR_NONE;
}